

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

bool filemgr_invalidate_block(filemgr *file,bid_t bid)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (file->last_commit).super___atomic_base<unsigned_long>._M_i;
  uVar1 = file->blocksize;
  if (0 < global_config.ncacheblock) {
    bcache_invalidate_block(file,bid);
  }
  return uVar2 < uVar1 * bid;
}

Assistant:

bool filemgr_invalidate_block(struct filemgr *file, bid_t bid)
{
    bool ret;
    if (atomic_get_uint64_t(&file->last_commit) < bid * file->blocksize) {
        ret = true; // block invalidated was allocated recently (uncommitted)
    } else {
        ret = false; // a block from the past is invalidated (committed)
    }
    if (global_config.ncacheblock > 0) {
        bcache_invalidate_block(file, bid);
    }
    return ret;
}